

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall i2i::format<8,12>(i2i *this,context *ctx,token *token,opcode *op)

{
  _Storage<unsigned_long,_true> _Var1;
  uint64_t uVar2;
  string_view prefix;
  string_view prefix_00;
  optional<unsigned_long> oVar3;
  token local_48;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar3 = find_in_table(token,format<8,_12>::table_unsigned,prefix);
  _Var1._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    prefix_00._M_str = ".";
    prefix_00._M_len = 1;
    oVar3 = find_in_table(token,format<8,_12>::table_signed,prefix_00);
    _Var1._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      fail((token *)this,(char *)token,"expected .U8, .U16, .U32, .S8, .S16 or .S32");
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
    if (((uint)op->value >> 0xc & 1) != 0) goto LAB_001243fa;
    uVar2 = op->value | 0x1000;
    op->value = uVar2;
  }
  else {
    uVar2 = op->value;
  }
  if ((_Var1._M_value << 8 & uVar2) == 0) {
    op->value = _Var1._M_value << 8 | uVar2;
    context::tokenize(&local_48,ctx);
    token->column = local_48.column;
    (token->data).string._M_str = local_48.data.string._M_str;
    token->type = local_48.type;
    token->line = local_48.line;
    token->filename = local_48.filename;
    (token->data).predicate = local_48.data.predicate;
    *(undefined8 *)this = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)this;
  }
LAB_001243fa:
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(format)
    {
        static const char* table_unsigned[] = {"U8", "U16", "U32", nullptr};
        static const char* table_signed[] = {"S8", "S16", "S32", nullptr};

        std::optional<int64_t> result = find_in_table(token, table_unsigned, ".");
        if (!result) {
            result = find_in_table(token, table_signed, ".");
            if (!result) {
                return fail(token, "expected .U8, .U16, .U32, .S8, .S16 or .S32");
            }
            op.add_bits(1ULL << sign_address);
        }
        op.add_bits(*result << address);
        token = ctx.tokenize();
        return {};
    }